

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O1

void __thiscall
kj::anon_unknown_0::TestChild::TestChild(TestChild *this,UnixEventPort *port,int exitCode)

{
  Disposer *pDVar1;
  PromiseNode *pPVar2;
  Timer TVar3;
  __pid_t _Var4;
  int iVar5;
  Promise<int> PVar6;
  Fault f;
  sigset_t sigs;
  Fault local_b0;
  EventPort local_a8;
  Timer TStack_a0;
  
  (this->pid).ptr.isSet = false;
  (this->promise).super_PromiseBase.node.disposer = (Disposer *)0x0;
  (this->promise).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  do {
    _Var4 = fork();
    if (-1 < _Var4) {
      iVar5 = 0;
      break;
    }
    iVar5 = _::Debug::getOsErrorNumber(false);
  } while (iVar5 == -1);
  if (iVar5 != 0) {
    local_b0.exception = (Exception *)0x0;
    local_a8._vptr_EventPort = (_func_int **)0x0;
    TStack_a0._vptr_Timer = (_func_int **)0x0;
    _::Debug::Fault::init
              (&local_b0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    _::Debug::Fault::fatal(&local_b0);
  }
  if (_Var4 != 0) {
    if ((this->pid).ptr.isSet == true) {
      (this->pid).ptr.isSet = false;
    }
    (this->pid).ptr.field_1.value = _Var4;
    (this->pid).ptr.isSet = true;
    PVar6 = UnixEventPort::onChildExit((UnixEventPort *)&stack0xffffffffffffff58,(Maybe<int> *)port)
    ;
    pDVar1 = (this->promise).super_PromiseBase.node.disposer;
    pPVar2 = (this->promise).super_PromiseBase.node.ptr;
    (this->promise).super_PromiseBase.node.disposer = (Disposer *)local_a8._vptr_EventPort;
    (this->promise).super_PromiseBase.node.ptr = (PromiseNode *)TStack_a0._vptr_Timer;
    TStack_a0._vptr_Timer = (_func_int **)0x0;
    if (pPVar2 != (PromiseNode *)0x0) {
      (**pDVar1->_vptr_Disposer)
                (pDVar1,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode,
                 PVar6.super_PromiseBase.node.ptr);
    }
    TVar3._vptr_Timer = TStack_a0._vptr_Timer;
    if (TStack_a0._vptr_Timer != (_func_int **)0x0) {
      TStack_a0._vptr_Timer = (_func_int **)0x0;
      (**(_func_int **)*local_a8._vptr_EventPort)
                (local_a8._vptr_EventPort,
                 (long)TVar3._vptr_Timer + *(long *)(*TVar3._vptr_Timer + -0x10));
    }
    return;
  }
  (anonymous_namespace)::exitCodeForSignal = exitCode;
  signal(0xf,exitSignalHandler);
  sigemptyset((sigset_t *)&stack0xffffffffffffff58);
  sigaddset((sigset_t *)&stack0xffffffffffffff58,0xf);
  sigprocmask(1,(sigset_t *)&stack0xffffffffffffff58,(sigset_t *)0x0);
  do {
    pause();
  } while( true );
}

Assistant:

TestChild(UnixEventPort& port, int exitCode) {
    pid_t p;
    KJ_SYSCALL(p = fork());
    if (p == 0) {
      // Arrange for SIGTERM to cause the process to exit normally.
      exitCodeForSignal = exitCode;
      signal(SIGTERM, &exitSignalHandler);
      sigset_t sigs;
      sigemptyset(&sigs);
      sigaddset(&sigs, SIGTERM);
      sigprocmask(SIG_UNBLOCK, &sigs, nullptr);

      for (;;) pause();
    }
    pid = p;
    promise = port.onChildExit(pid);
  }